

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

plink * Plink_new(void)

{
  plink *ppVar1;
  plink *ppVar2;
  long lVar3;
  bool bVar4;
  
  ppVar2 = plink_freelist;
  if (plink_freelist == (plink *)0x0) {
    ppVar2 = (plink *)calloc(100,0x10);
    if (ppVar2 == (plink *)0x0) {
      plink_freelist = ppVar2;
      fwrite("Unable to allocate memory for a new follow-set propagation link.\n",0x41,1,_stderr);
      exit(1);
    }
    lVar3 = 99;
    ppVar1 = ppVar2;
    while( true ) {
      bVar4 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (bVar4) break;
      ppVar1->next = ppVar1 + 1;
      ppVar1 = ppVar1 + 1;
    }
    ppVar2[99].next = (plink *)0x0;
  }
  plink_freelist = ppVar2->next;
  return ppVar2;
}

Assistant:

struct plink *Plink_new(void){
  struct plink *newlink;

  if( plink_freelist==0 ){
    int i;
    int amt = 100;
    plink_freelist = (struct plink *)calloc( amt, sizeof(struct plink) );
    if( plink_freelist==0 ){
      fprintf(stderr,
      "Unable to allocate memory for a new follow-set propagation link.\n");
      exit(1);
    }
    for(i=0; i<amt-1; i++) plink_freelist[i].next = &plink_freelist[i+1];
    plink_freelist[amt-1].next = 0;
  }
  newlink = plink_freelist;
  plink_freelist = plink_freelist->next;
  return newlink;
}